

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstEvaluateVisitor.cpp
# Opt level: O3

void __thiscall
IRT::ConstEvaluateVisitor::Visit(ConstEvaluateVisitor *this,CNameExpression *expression)

{
  CExpression *pCVar1;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var2;
  CExpression *in_RAX;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*(expression->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (CExpression *)0x0;
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pCVar1 != (CExpression *)0x0) {
    (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
    if (local_18._M_head_impl != (CExpression *)0x0) {
      (*((local_18._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
  }
  return;
}

Assistant:

void IRT::ConstEvaluateVisitor::Visit(const IRT::CNameExpression &expression) {
    childExpression = M(expression.Copy());
}